

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

ModuleRecordList * __thiscall Js::JavascriptLibrary::EnsureModuleRecordList(JavascriptLibrary *this)

{
  ModuleRecordList *pMVar1;
  Recycler *alloc;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *ptr;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pMVar1 = (this->moduleRecordList).ptr;
  if (pMVar1 != (ModuleRecordList *)0x0) {
    return pMVar1;
  }
  local_40 = (undefined1  [8])
             &JsUtil::
              List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1c95;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_40);
  ptr = (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
  (ptr->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).alloc =
       this->recycler;
  (ptr->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01387f90;
  (ptr->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).buffer.
  ptr = (WriteBarrierPtr<Js::SourceTextModuleRecord> *)0x0;
  (ptr->super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).count =
       0;
  ptr->length = 0;
  ptr->increment = 4;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierSet(&this->moduleRecordList,ptr);
  return (this->moduleRecordList).ptr;
}

Assistant:

ModuleRecordList* JavascriptLibrary::EnsureModuleRecordList()
    {
        if (moduleRecordList == nullptr)
        {
            moduleRecordList = RecyclerNew(recycler, ModuleRecordList, recycler);
        }
        return moduleRecordList;
    }